

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_bench.cc
# Opt level: O0

int main(void)

{
  result_type_conflict rVar1;
  ostream *poVar2;
  result_type rVar3;
  reference pvVar4;
  reference pvVar5;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2860;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2848;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2830;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2818;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_2800;
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
  local_27e8;
  value_type local_27d0;
  value_type local_27c8;
  value_type local_27c0;
  value_type local_27b8;
  ulong local_27b0;
  uint64_t i_1;
  undefined1 local_27a0 [8];
  vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> elements;
  uint64_t i;
  undefined1 local_2778 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertex_ids;
  uniform_int_distribution<unsigned_long> elem_id_dist;
  uniform_int_distribution<unsigned_long> vertex_id_dist;
  undefined1 local_2730 [8];
  mt19937 gen;
  random_device rd;
  uint64_t nelements;
  uint64_t nvertices;
  
  std::random_device::random_device((random_device *)&gen._M_p);
  rVar1 = std::random_device::operator()((random_device *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2730,(ulong)rVar1);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&elem_id_dist._M_param._M_b,0,0x800000000);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)
             &vertex_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,4999999);
  poVar2 = std::operator<<((ostream *)&std::cout,"generating dataset .");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,5000000,
             (allocator<unsigned_long> *)((long)&i + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i + 7));
  for (elements.
       super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      elements.
      super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage < (pointer)0x4c4b40;
      elements.
      super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)(elements.
                            super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems + 1)) {
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)&elem_id_dist._M_param._M_b,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_2730);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,
                        (size_type)
                        elements.
                        super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *pvVar4 = rVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,".");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  std::allocator<std::array<unsigned_long,_4UL>_>::allocator
            ((allocator<std::array<unsigned_long,_4UL>_> *)((long)&i_1 + 7));
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector((vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )local_27a0,25000000,(allocator<std::array<unsigned_long,_4UL>_> *)((long)&i_1 + 7));
  std::allocator<std::array<unsigned_long,_4UL>_>::~allocator
            ((allocator<std::array<unsigned_long,_4UL>_> *)((long)&i_1 + 7));
  for (local_27b0 = 0; local_27b0 < 25000000; local_27b0 = local_27b0 + 1) {
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)
                       &vertex_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_2730);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,rVar3);
    local_27d0 = *pvVar4;
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)
                       &vertex_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_2730);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,rVar3);
    local_27c8 = *pvVar4;
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)
                       &vertex_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_2730);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,rVar3);
    local_27c0 = *pvVar4;
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)
                       &vertex_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_2730);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,rVar3);
    local_27b8 = *pvVar4;
    pvVar5 = std::
             vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
             ::operator[]((vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                           *)local_27a0,local_27b0);
    pvVar5->_M_elems[0] = local_27d0;
    pvVar5->_M_elems[1] = local_27c8;
    pvVar5->_M_elems[2] = local_27c0;
    pvVar5->_M_elems[3] = local_27b8;
  }
  poVar2 = std::operator<<((ostream *)&std::cout," done");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"std::unordered_map, 1 thread: ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_27e8,
         (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )local_27a0);
  renumber<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,&local_27e8,1);
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~vector(&local_27e8);
  std::operator<<((ostream *)&std::cout,
                  "std::unordered_map, 32 thread (single threaded insertion): ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_2800,
         (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )local_27a0);
  renumber<std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,&local_2800,0x20);
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~vector(&local_2800);
  std::operator<<((ostream *)&std::cout,"pmap4, 1 thread: ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_2818,
         (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )local_27a0);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,phmap::NullMutex>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,&local_2818,1);
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~vector(&local_2818);
  std::operator<<((ostream *)&std::cout,"pmap4, 32 threads: ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_2830,
         (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )local_27a0);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,phmap::NullMutex>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,&local_2830,0x20);
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~vector(&local_2830);
  std::operator<<((ostream *)&std::cout,"pmap6, 1 thread: ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_2848,
         (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )local_27a0);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,phmap::NullMutex>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,&local_2848,1);
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~vector(&local_2848);
  std::operator<<((ostream *)&std::cout,"pmap6, 32 threads: ");
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  vector(&local_2860,
         (vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_> *
         )local_27a0);
  renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,6ul,phmap::NullMutex>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778,&local_2860,0x20);
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~vector(&local_2860);
  std::vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>::
  ~vector((vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
           *)local_27a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2778);
  std::random_device::~random_device((random_device *)&gen._M_p);
  return 0;
}

Assistant:

int main() {
    uint64_t nvertices = 5000000;
    uint64_t nelements = 25000000;

    std::random_device rd;  // a seed source for the random number engine
    std::mt19937 gen(rd()); // mersenne_twister_engine seeded with rd()
    std::uniform_int_distribution<uint64_t> vertex_id_dist(0, uint64_t(1) << 35);
    std::uniform_int_distribution<uint64_t> elem_id_dist(0, nvertices-1);

    std::cout << "generating dataset ." << std::flush;
    std::vector< uint64_t > vertex_ids(nvertices);
    for (uint64_t i = 0; i < nvertices; i++) {
        vertex_ids[i] = vertex_id_dist(gen);
    }

    std::cout << "." << std::flush;

    std::vector< std::array<uint64_t, 4> > elements(nelements);
    for (uint64_t i = 0; i < nelements; i++) {
        elements[i] = {
            vertex_ids[elem_id_dist(gen)], 
            vertex_ids[elem_id_dist(gen)], 
            vertex_ids[elem_id_dist(gen)], 
            vertex_ids[elem_id_dist(gen)]
        };
    }
    std::cout << " done" << std::endl;

    using stdmap = std::unordered_map<uint64_t, uint64_t>;
    std::cout << "std::unordered_map, 1 thread: ";
    renumber< stdmap, stdmap >(vertex_ids, elements, 1);

    std::cout << "std::unordered_map, 32 thread (single threaded insertion): ";
    renumber< stdmap, stdmap >(vertex_ids, elements, 32);

    std::cout << "pmap4, 1 thread: ";
    renumber< pmap<4>, pmap_nullmutex<4> >(vertex_ids, elements, 1);

    std::cout << "pmap4, 32 threads: ";
    renumber< pmap<4>, pmap_nullmutex<4> >(vertex_ids, elements, 32);

    std::cout << "pmap6, 1 thread: ";
    renumber< pmap<6>, pmap_nullmutex<6> >(vertex_ids, elements, 1);

    std::cout << "pmap6, 32 threads: ";
    renumber< pmap<6>, pmap_nullmutex<6> >(vertex_ids, elements, 32);
}